

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_gamemtls_lib.cxx
# Opt level: O2

bool __thiscall xray_re::xr_gamemtls_lib::load(xr_gamemtls_lib *this,string *path)

{
  xr_file_system *this_00;
  xr_reader *r;
  
  this_00 = xr_file_system::instance();
  r = xr_file_system::r_open(this_00,path);
  if (r != (xr_reader *)0x0) {
    load(this,r);
    (*r->_vptr_xr_reader[1])(r);
  }
  return r != (xr_reader *)0x0;
}

Assistant:

bool xr_gamemtls_lib::load(const std::string& path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;
	load(*r);
	fs.r_close(r);
	return true;
}